

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

void perlinInit(PerlinNoise *noise,uint64_t *seed)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint8_t uVar8;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  double dVar9;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  double dVar25;
  
  lVar3 = *seed * 0x5deece66d + 0xb;
  uVar4 = lVar3 * 0x5deece66d + 0xb;
  lVar5 = (uVar4 & 0xffffffffffff) * 0x5deece66d + 0xb;
  uVar6 = lVar5 * 0x5deece66d + 0xb;
  noise->a = (double)(uVar4 >> 0x15 & 0x7ffffff | lVar3 * 0x20 & 0x1ffffff8000000U) *
             1.1102230246251565e-16 * 256.0;
  noise->b = (double)(uVar6 >> 0x15 & 0x7ffffff | lVar5 * 0x20 & 0x1ffffff8000000U) *
             1.1102230246251565e-16 * 256.0;
  uVar4 = (uVar6 & 0xffffffffffff) * 0x5deece66d + 0xb;
  uVar6 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
  *seed = uVar6;
  noise->c = (double)(uVar6 >> 0x15 | (uVar4 & 0xffffffc00000) << 5) * 1.1102230246251565e-16 *
             256.0;
  noise->amplitude = 1.0;
  noise->lacunarity = 1.0;
  uVar8 = '\0';
  uVar10 = '\x01';
  uVar11 = '\x02';
  uVar12 = '\x03';
  uVar13 = '\x04';
  uVar14 = '\x05';
  uVar15 = '\x06';
  uVar16 = '\a';
  uVar17 = '\b';
  uVar18 = '\t';
  uVar19 = '\n';
  uVar20 = '\v';
  uVar21 = '\f';
  uVar22 = '\r';
  uVar23 = '\x0e';
  uVar24 = '\x0f';
  lVar3 = 0;
  do {
    puVar1 = noise->d + lVar3;
    *puVar1 = uVar8;
    puVar1[1] = uVar10;
    puVar1[2] = uVar11;
    puVar1[3] = uVar12;
    puVar1[4] = uVar13;
    puVar1[5] = uVar14;
    puVar1[6] = uVar15;
    puVar1[7] = uVar16;
    puVar1[8] = uVar17;
    puVar1[9] = uVar18;
    puVar1[10] = uVar19;
    puVar1[0xb] = uVar20;
    puVar1[0xc] = uVar21;
    puVar1[0xd] = uVar22;
    puVar1[0xe] = uVar23;
    puVar1[0xf] = uVar24;
    lVar3 = lVar3 + 0x10;
    uVar8 = uVar8 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
    uVar21 = uVar21 + '\x10';
    uVar22 = uVar22 + '\x10';
    uVar23 = uVar23 + '\x10';
    uVar24 = uVar24 + '\x10';
  } while (lVar3 != 0x100);
  lVar3 = 0;
  do {
    uVar4 = 0x100 - lVar3;
    uVar7 = *seed;
    if (((uint)uVar4 & (uint)uVar4 - 1) == 0) {
      uVar6 = uVar7 * 0x5deece66d + 0xb & 0xffffffffffff;
      *seed = uVar6;
      iVar2 = (int)((uVar6 >> 0x11) * uVar4 >> 0x1f);
    }
    else {
      do {
        uVar7 = uVar7 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar2 = (int)((uVar7 >> 0x11) % (uVar4 & 0xffffffff));
      } while (-1 < (iVar2 + (int)lVar3 + -0x100) - (int)(uVar7 >> 0x11));
      *seed = uVar7;
    }
    iVar2 = (int)lVar3 + iVar2;
    uVar8 = noise->d[lVar3];
    noise->d[lVar3] = noise->d[iVar2];
    noise->d[iVar2] = uVar8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  noise->d[0x100] = noise->d[0];
  dVar25 = noise->b;
  dVar9 = floor(dVar25);
  dVar25 = dVar25 - dVar9;
  noise->h2 = (uint8_t)(int)dVar9;
  noise->d2 = dVar25;
  noise->t2 = ((dVar25 * 6.0 + -15.0) * dVar25 + 10.0) * dVar25 * dVar25 * dVar25;
  return;
}

Assistant:

void perlinInit(PerlinNoise *noise, uint64_t *seed)
{
    int i = 0;
    //memset(noise, 0, sizeof(*noise));
    noise->a = nextDouble(seed) * 256.0;
    noise->b = nextDouble(seed) * 256.0;
    noise->c = nextDouble(seed) * 256.0;
    noise->amplitude = 1.0;
    noise->lacunarity = 1.0;

    uint8_t *idx = noise->d;
    for (i = 0; i < 256; i++)
    {
        idx[i] = i;
    }
    for (i = 0; i < 256; i++)
    {
        int j = nextInt(seed, 256 - i) + i;
        uint8_t n = idx[i];
        idx[i] = idx[j];
        idx[j] = n;
    }
    idx[256] = idx[0];
    double i2 = floor(noise->b);
    double d2 = noise->b - i2;
    noise->h2 = (int) i2;
    noise->d2 = d2;
    noise->t2 = d2*d2*d2 * (d2 * (d2*6.0-15.0) + 10.0);
}